

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printReconstructedExpression(TapAssertionPrinter *this)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  undefined8 *in_RDI;
  string expr;
  ColourGuard *in_stack_ffffffffffffff78;
  char *__new_value;
  ColourGuard *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  AssertionResult *in_stack_ffffffffffffffb8;
  AssertionResult *in_stack_ffffffffffffffd8;
  ColourImpl local_18;
  
  bVar1 = AssertionResult::hasExpandedExpression(in_stack_ffffffffffffffd8);
  if (bVar1) {
    this_00 = (ColourGuard *)*in_RDI;
    __last._M_current = (char *)&local_18;
    ColourImpl::guardColour((ColourImpl *)__last._M_current,(Code)((ulong)this_00 >> 0x20));
    __first._M_current = (char *)Catch::operator<<((ostream *)this_00,in_stack_ffffffffffffff78);
    std::operator<<((ostream *)__first._M_current," for: ");
    ColourImpl::ColourGuard::~ColourGuard(this_00);
    __new_value = &stack0xffffffffffffffb8;
    AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_ffffffffffffffb8);
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,__last,(char *)this_00,__new_value);
    std::operator<<((ostream *)*in_RDI,(string *)&stack0xffffffffffffffb8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if (result.hasExpandedExpression()) {
                    stream << colourImpl->guardColour( tapDimColour ) << " for: ";

                    std::string expr = result.getExpandedExpression();
                    std::replace(expr.begin(), expr.end(), '\n', ' ');
                    stream << expr;
                }
            }